

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O2

void __thiscall clickhouse::ColumnEnum<short>::Append(ColumnEnum<short> *this,ColumnRef *column)

{
  shared_ptr<clickhouse::ColumnEnum<short>_> col;
  _func_int **local_20;
  
  Column::As<clickhouse::ColumnEnum<short>>((Column *)&stack0xffffffffffffffe0);
  if (local_20 != (_func_int **)0x0) {
    std::vector<short,std::allocator<short>>::
    insert<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,void>
              ((vector<short,std::allocator<short>> *)&this->data_,
               (const_iterator)
               (this->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)local_20[5],
               (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)local_20[6])
    ;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void ColumnEnum<T>::Append(ColumnRef column) {
    if (auto col = column->As<ColumnEnum<T>>()) {
        data_.insert(data_.end(), col->data_.begin(), col->data_.end());
    }
}